

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.hpp
# Opt level: O1

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 pstore::utf::code_point_to_utf8<char,std::back_insert_iterator<std::__cxx11::string>>
           (char32_t c,
           back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           out)

{
  char cVar1;
  char32_t cVar2;
  
  do {
    cVar2 = c;
    cVar1 = (char)out.container;
    if ((uint)cVar2 < 0x80) goto LAB_00118487;
    if ((uint)cVar2 < 0x800) goto LAB_00118474;
    c = L'�';
  } while (0x10ffff < (uint)cVar2 || (cVar2 & 0xfffff800U) == 0xd800);
  if (0xffff < (uint)cVar2) {
    std::__cxx11::string::push_back(cVar1);
  }
  std::__cxx11::string::push_back(cVar1);
LAB_00118474:
  std::__cxx11::string::push_back(cVar1);
LAB_00118487:
  std::__cxx11::string::push_back(cVar1);
  return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )out.container;
}

Assistant:

auto code_point_to_utf8 (char32_t const c, OutputIt out) -> OutputIt {
            if (c < 0x80) {
                *(out++) = static_cast<CharType> (c);
            } else if (c < 0x800) {
                *(out++) = static_cast<CharType> (c / 64U + 0xC0U);
                *(out++) = static_cast<CharType> (c % 64U + 0x80U);
            } else if ((c >= 0xD800 && c < 0xE000) || c >= 0x110000) {
                out = replacement_char<CharType> (out);
            } else if (c < 0x10000) {
                *(out++) = static_cast<CharType> ((c / 0x1000U) | 0xE0U);
                *(out++) = static_cast<CharType> ((c / 64U % 64U) | 0x80U);
                *(out++) = static_cast<CharType> ((c % 64U) | 0x80U);
            } else {
                PSTORE_ASSERT (c < 0x110000);
                *(out++) = static_cast<CharType> ((c / 0x40000U) | 0xF0U);
                *(out++) = static_cast<CharType> ((c / 0x1000U % 64U) | 0x80U);
                *(out++) = static_cast<CharType> ((c / 64U % 64U) | 0x80U);
                *(out++) = static_cast<CharType> ((c % 64U) | 0x80U);
            }
            return out;
        }